

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenAddressHash.h
# Opt level: O0

void __thiscall
OpenAddressHash<int,_int>::OpenAddressHash
          (OpenAddressHash<int,_int> *this,ion_dictionary_config_info_t config)

{
  int __oflag;
  char *in_RSI;
  OpenAddressHash<int,_int> *this_local;
  
  oadict_init((ion_dictionary_handler_t *)this);
  Dictionary<int,_int>::open(&this->super_Dictionary<int,_int>,in_RSI,__oflag);
  return;
}

Assistant:

OpenAddressHash(
	ion_dictionary_config_info_t config
) {
	oadict_init(&this->handler);

	this->open(config);
}